

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O1

void __thiscall MathInterpreter::separateInput(MathInterpreter *this,string *input_arg)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  pointer pcVar4;
  list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *plVar5;
  _Node *p_Var6;
  undefined8 *puVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  char *local_58;
  undefined1 local_50 [8];
  string temp;
  
  local_50 = (undefined1  [8])&temp._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  pcVar3 = (input_arg->_M_dataplus)._M_p;
  uVar10 = 0;
  if ((*pcVar3 == '-') && (1 < input_arg->_M_string_length)) {
    uVar11 = 0;
    if ((byte)(pcVar3[1] - 0x30U) < 10) {
      std::__cxx11::string::push_back((char)local_50);
      if (input_arg->_M_string_length < 2) {
        uVar11 = 0;
        uVar10 = 1;
      }
      else {
        uVar10 = 1;
        uVar11 = 0;
        do {
          cVar8 = (input_arg->_M_dataplus)._M_p[uVar10];
          if (cVar8 != '.' && 9 < (byte)(cVar8 - 0x30U)) break;
          std::__cxx11::string::push_back((char)local_50);
          uVar11 = uVar11 + (cVar8 == '.');
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (uVar10 < input_arg->_M_string_length);
      }
      if (1 < uVar11) {
        local_58 = "Invalid input";
LAB_0010d897:
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = local_58;
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
      plVar5 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->input;
      p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         (plVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_50);
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      plVar5 = plVar5 + 0x10;
      *(long *)plVar5 = *(long *)plVar5 + 1;
      std::__cxx11::string::_M_replace((ulong)local_50,0,temp._M_dataplus._M_p,0x11031b);
    }
  }
  else {
    uVar11 = 0;
  }
  local_58 = "invalid input_arg2";
  do {
    if (input_arg->_M_string_length <= uVar10) {
      if (local_50 != (undefined1  [8])&temp._M_string_length) {
        operator_delete((void *)local_50,temp._M_string_length + 1);
      }
      return;
    }
    pcVar4 = (input_arg->_M_dataplus)._M_p;
    bVar1 = pcVar4[uVar10];
    uVar9 = (uint)uVar10;
    cVar8 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
    if ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) {
      std::__cxx11::string::push_back(cVar8);
      while( true ) {
        uVar9 = uVar9 + 1;
        uVar10 = (ulong)uVar9;
        if ((input_arg->_M_string_length <= uVar10) ||
           ((((cVar2 = (input_arg->_M_dataplus)._M_p[uVar10], 0x19 < (byte)(cVar2 + 0x9fU) &&
              (9 < (byte)(cVar2 - 0x30U))) && (cVar2 != '_')) && (0x19 < (byte)(cVar2 + 0xbfU)))))
        break;
        std::__cxx11::string::push_back(cVar8);
      }
    }
    else if ((byte)(bVar1 - 0x30) < 10) {
      std::__cxx11::string::push_back(cVar8);
      while( true ) {
        uVar9 = uVar9 + 1;
        uVar10 = (ulong)uVar9;
        if ((input_arg->_M_string_length <= uVar10) ||
           (cVar2 = (input_arg->_M_dataplus)._M_p[uVar10], cVar2 != '.' && 9 < (byte)(cVar2 - 0x30U)
           )) break;
        uVar11 = uVar11 + (cVar2 == '.');
        std::__cxx11::string::push_back(cVar8);
      }
      if (1 < uVar11) {
        local_58 = "invalid input_arg3";
        goto LAB_0010d897;
      }
    }
    else {
      if ((3 < bVar1 - 0x28) && (bVar1 != 0x2f)) {
        if (bVar1 != 0x2d) goto LAB_0010d897;
        if (((uVar10 != 0 && (ulong)(uVar9 + 1) < input_arg->_M_string_length) &&
            (pcVar4[uVar9 - 1] == '(')) && ((byte)(pcVar4[uVar9 + 1] - 0x30U) < 10)) {
          std::__cxx11::string::push_back(cVar8);
          std::__cxx11::string::push_back(cVar8);
          uVar9 = uVar9 + 2;
          while ((uVar10 = (ulong)uVar9, uVar10 < input_arg->_M_string_length &&
                 (cVar2 = (input_arg->_M_dataplus)._M_p[uVar10],
                 cVar2 == '.' || (byte)(cVar2 - 0x30U) < 10))) {
            std::__cxx11::string::push_back(cVar8);
            uVar11 = uVar11 + (cVar2 == '.');
            uVar9 = uVar9 + 1;
          }
          goto LAB_0010d7d5;
        }
      }
      std::__cxx11::string::push_back(cVar8);
      uVar10 = (ulong)(uVar9 + 1);
    }
LAB_0010d7d5:
    plVar5 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->input;
    p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<std::__cxx11::string_const&>
                       (plVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_50);
    std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
    plVar5 = plVar5 + 0x10;
    *(long *)plVar5 = *(long *)plVar5 + 1;
    std::__cxx11::string::_M_replace((ulong)local_50,0,temp._M_dataplus._M_p,0x11031b);
  } while( true );
}

Assistant:

void MathInterpreter::separateInput(string input_arg) {//-rol/70
  string temp = "";
  unsigned int start = 0, count = 0;
  //check negative number in begining of string
  if ((input_arg[start] == '-') && (input_arg.size() > 1)
      && (input_arg[1] <= '9') && (input_arg[1] >= '0')) {
    temp += input_arg[start];
    start++;
    while ((start < input_arg.size())
        && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
            || (input_arg[start] == '.'))) {
      if (input_arg[start] == '.') {
        count++;
      }
      temp += input_arg[start];
      start++;
    }
    if (count > 1) {
      throw ("Invalid input");
    }
    this->input->push_back(temp);
    temp = "";
  }
  while (start < input_arg.size()) {
    if (((input_arg[start] <= 'z') && (input_arg[start] >= 'a'))
        || ((input_arg[start] <= 'Z') && (input_arg[start] >= 'A'))) {
      temp += input_arg[start];
      start++;
      while (start < input_arg.size()
          && (((input_arg[start] <= 'z') && (input_arg[start] >= 'a'))
              || ((input_arg[start] <= 'Z') && (input_arg[start] >= 'A'))
              || (input_arg[start] == '_')
              || ((input_arg[start] <= '9') && (input_arg[start] >= '0')))) {
        temp += input_arg[start];
        start++;
      }
    } else if ((input_arg[start] <= '9') && (input_arg[start] >= '0')) {
      temp += input_arg[start];
      start++;
      while ((start < input_arg.size())
          && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
              || (input_arg[start] == '.'))) {
        if (input_arg[start] == '.') {
          count++;
        }
        temp += input_arg[start];
        start++;
      }
      if (count > 1) {
        throw ("invalid input_arg3");
      }
    } else if ((input_arg[start] == '(') || (input_arg[start] == ')')
        || (input_arg[start] == '+') || (input_arg[start] == '-')
        || (input_arg[start] == '*') || (input_arg[start] == '/')) {
      //check for negative number in input_arg
      if ((input_arg[start] == '-') && (input_arg.size() > start + 1)
          && (start > 0) && (input_arg[start - 1] == '(')
          && (input_arg[start + 1] <= '9') && (input_arg[start + 1] >= '0')) {
        temp += (input_arg[start]);
        start++;
        temp += (input_arg[start]);
        start++;
        while ((start < input_arg.size())
            && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
                || (input_arg[start] == '.'))) {
          if (input_arg[start] == '.') {
            count++;
          }
          temp += input_arg[start];
          start++;
        }
      } else {
        temp += input_arg[start];
        start++;
      }
    } else {
      throw ("invalid input_arg2");
    }
    this->input->push_back(temp);
    temp = "";
  }
}